

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

Wrench * __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::fromUsedRepresentationToBodyFixed
          (KinDynComputationsPrivateAttributes *this,Wrench *wrenchInUsedRepresentation,
          Transform *inertial_X_link)

{
  Wrench *in_RDX;
  long in_RSI;
  Rotation *in_RDI;
  Wrench local_c8;
  Wrench local_68;
  
  if (*(int *)(in_RSI + 4) == 1) {
    iDynTree::Wrench::Wrench((Wrench *)in_RDI,in_RDX);
  }
  else if (*(int *)(in_RSI + 4) == 2) {
    iDynTree::Transform::getRotation();
    iDynTree::Rotation::inverse();
    iDynTree::Rotation::operator*(in_RDI,&local_68);
  }
  else {
    iDynTree::Transform::inverse();
    iDynTree::Transform::operator*((Transform *)in_RDI,&local_c8);
  }
  return (Wrench *)in_RDI;
}

Assistant:

Wrench KinDynComputations::KinDynComputationsPrivateAttributes::fromUsedRepresentationToBodyFixed(const Wrench & wrenchInUsedRepresentation,
                                                                                                  const Transform & inertial_X_link)
{
    if (m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        return Wrench(wrenchInUsedRepresentation);
    }
    else if (m_frameVelRepr == MIXED_REPRESENTATION)
    {
        return (inertial_X_link.getRotation().inverse())*wrenchInUsedRepresentation;
    }
    else
    {
        assert(m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        return inertial_X_link.inverse()*wrenchInUsedRepresentation;
    }

    assert(false);
    return Wrench::Zero();
}